

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O2

void __thiscall ir_tree_visitor::add_class_symbols(ir_tree_visitor *this,string *class_name)

{
  mapped_type pBVar1;
  int iVar2;
  mapped_type *ppBVar3;
  MemExpression *this_00;
  Expression *expression;
  deque<IRT::Address*,std::allocator<IRT::Address*>> *this_01;
  AddressInFrame *this_02;
  size_t sVar4;
  mapped_type *pmVar5;
  string *this_03;
  long *plVar6;
  mapped_type mVar7;
  AddressInFrame *local_68;
  long *local_60;
  AddressInRegister *local_58;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  string *local_48;
  ir_tree_visitor *local_40;
  allocator<char> local_31;
  
  local_48 = class_name;
  ppBVar3 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BaseSymbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->curr_scope->symbols,class_name);
  pBVar1 = *ppBVar3;
  iVar2 = (**pBVar1->_vptr_BaseSymbol)(pBVar1);
  if (iVar2 == 0) {
    local_60 = *(long **)((long)&pBVar1[1].name.field_2 + 8);
    local_58 = &this->frame_pointer_address;
    local_50 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->addresses;
    mVar7 = 0;
    local_40 = this;
    for (plVar6 = *(long **)&pBVar1[1].name.field_2; plVar6 != local_60; plVar6 = plVar6 + 1) {
      this_00 = (MemExpression *)operator_new(0x10);
      expression = IRT::AddressInRegister::ToExpression(local_58);
      IRT::MemExpression::MemExpression(this_00,expression);
      this_01 = (deque<IRT::Address*,std::allocator<IRT::Address*>> *)
                std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_50,(key_type *)(*plVar6 + 8));
      this_02 = (AddressInFrame *)operator_new(0x20);
      IRT::AddressInFrame::AddressInFrame(this_02,(Expression *)this_00,(int)mVar7);
      local_68 = this_02;
      std::deque<IRT::Address*,std::allocator<IRT::Address*>>::emplace_back<IRT::Address*>
                (this_01,(Address **)&local_68);
      sVar4 = get_size(*(Type **)(*plVar6 + 0x28));
      mVar7 = mVar7 + sVar4;
    }
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&local_40->class_sizes,local_48);
    *pmVar5 = mVar7;
    return;
  }
  this_03 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>(this_03,"unknown error\n",&local_31);
  __cxa_throw(this_03,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void ir_tree_visitor::add_class_symbols(std::string* class_name) {
    auto symbol = curr_scope->symbols[*class_name];
    if (symbol->SymbolType() != SYMBOL_CLASS) {
        throw std::string("unknown error\n");
    }
    auto class_symbol = reinterpret_cast<ClassSymbol*>(symbol);

    size_t offset = 0;
    for (auto& symbol: class_symbol->fields) {
        auto this_addr = new IRT::MemExpression(frame_pointer_address.ToExpression());
        addresses[symbol->name].push(new IRT::AddressInFrame(this_addr, offset));
        offset += get_size(symbol->type);
    }
    class_sizes[*class_name] = offset;
}